

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

void __thiscall cppcms::http::context::complete_response(context *this)

{
  bool bVar1;
  response *__f;
  run_ctx rn;
  shared_ptr<cppcms::http::context> cont;
  context *in_stack_ffffffffffffff68;
  connection *in_stack_ffffffffffffff70;
  response *in_stack_ffffffffffffff80;
  function<void_()> *in_stack_ffffffffffffffa8;
  service *in_stack_ffffffffffffffb0;
  shared_ptr<cppcms::impl::cgi::connection> *in_stack_ffffffffffffffe8;
  context *in_stack_fffffffffffffff0;
  
  response((context *)0x3a33e1);
  http::response::finalize(in_stack_ffffffffffffff80);
  std::__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x3a33f7);
  bVar1 = cppcms::impl::cgi::connection::is_reuseable(in_stack_ffffffffffffff70);
  if (bVar1) {
    __f = (response *)operator_new(0x28);
    in_stack_ffffffffffffff80 = __f;
    std::shared_ptr<cppcms::impl::cgi::connection>::shared_ptr
              ((shared_ptr<cppcms::impl::cgi::connection> *)in_stack_ffffffffffffff70,
               (shared_ptr<cppcms::impl::cgi::connection> *)in_stack_ffffffffffffff68);
    context(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
    std::shared_ptr<cppcms::http::context>::shared_ptr<cppcms::http::context,void>
              ((shared_ptr<cppcms::http::context> *)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    std::shared_ptr<cppcms::impl::cgi::connection>::~shared_ptr
              ((shared_ptr<cppcms::impl::cgi::connection> *)0x3a346d);
    std::shared_ptr<cppcms::http::context>::shared_ptr
              ((shared_ptr<cppcms::http::context> *)in_stack_ffffffffffffff70,
               (shared_ptr<cppcms::http::context> *)in_stack_ffffffffffffff68);
    service((context *)0x3a3489);
    std::function<void()>::function<cppcms::http::(anonymous_namespace)::run_ctx&,void>
              ((function<void_()> *)in_stack_ffffffffffffff80,(run_ctx *)__f);
    cppcms::service::post(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::function<void_()>::~function((function<void_()> *)0x3a34bc);
    anon_unknown_3::run_ctx::~run_ctx((run_ctx *)0x3a34c6);
    std::shared_ptr<cppcms::http::context>::~shared_ptr
              ((shared_ptr<cppcms::http::context> *)0x3a34d3);
  }
  std::__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2> *)
             in_stack_ffffffffffffff80);
  return;
}

Assistant:

void context::complete_response()
{
	response().finalize();
	if(conn_->is_reuseable()) {
		booster::shared_ptr<context> cont(new context(conn_));
		run_ctx rn = { cont };
		service().post(rn);
	}
	conn_.reset();
}